

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1555.c
# Opt level: O3

int progressCallback(void *arg,double dltotal,double dlnow,double ultotal,double ulnow)

{
  undefined4 uVar1;
  size_t n;
  char buffer [256];
  undefined8 local_120;
  undefined1 local_118 [264];
  
  local_120 = 0;
  uVar1 = curl_easy_recv(curl,local_118,0x100,&local_120);
  curl_mprintf("curl_easy_recv returned %d\n",uVar1);
  uVar1 = curl_easy_send(curl,local_118,local_120,&local_120);
  curl_mprintf("curl_easy_send returned %d\n",uVar1);
  return 1;
}

Assistant:

static int progressCallback(void *arg,
                            double dltotal,
                            double dlnow,
                            double ultotal,
                            double ulnow)
{
  CURLcode res = 0;
  char buffer[256];
  size_t n = 0;
  (void)arg;
  (void)dltotal;
  (void)dlnow;
  (void)ultotal;
  (void)ulnow;
  res = curl_easy_recv(curl, buffer, 256, &n);
  printf("curl_easy_recv returned %d\n", res);
  res = curl_easy_send(curl, buffer, n, &n);
  printf("curl_easy_send returned %d\n", res);

  return 1;
}